

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O2

uint * Gia_ManConvertAigToTruth
                 (Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vTruth,
                 Vec_Int_t *vVisited)

{
  Vec_Int_t *pVVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  void *pvVar6;
  long lVar7;
  int *__ptr;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint (*pauVar14) [8];
  uint (*pIn) [8];
  ulong uVar15;
  uint uVar16;
  
  iVar12 = vLeaves->nSize;
  uVar15 = (ulong)iVar12;
  bVar2 = (char)iVar12 - 5U & 0x1f;
  uVar16 = 1 << bVar2;
  uVar13 = (ulong)uVar16;
  if ((long)uVar15 < 6) {
    uVar13 = 1;
  }
  iVar4 = (int)uVar13;
  if ((~*(ulong *)((ulong)pRoot & 0xfffffffffffffffe) & 0x1fffffff1fffffff) == 0) {
    vTruth->nSize = 0;
    puVar5 = Vec_IntFetch(vTruth,iVar4);
    if (((ulong)pRoot & 1) == 0) {
      for (; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
        puVar5[uVar13 - 1] = 0;
      }
    }
    else {
      for (; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
        puVar5[uVar13 - 1] = 0xffffffff;
      }
    }
  }
  else {
    if (iVar12 < 9) {
      __ptr = (int *)(ulong)(uint)(0 << bVar2);
    }
    else {
      pvVar6 = malloc(((long)(int)uVar16 * 4 + 8) * uVar15);
      lVar7 = uVar15 * 8;
      for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        *(long *)((long)pvVar6 + uVar10 * 8) = lVar7 + (long)pvVar6;
        lVar7 = lVar7 + (long)(int)uVar16 * 4;
      }
      __ptr = (int *)malloc(0x10);
      __ptr[1] = iVar12;
      *__ptr = iVar12;
      *(void **)(__ptr + 2) = pvVar6;
      uVar8 = 0;
      uVar10 = (ulong)uVar16;
      if (1 << bVar2 < 1) {
        uVar10 = uVar8;
      }
      for (; uVar8 != uVar15; uVar8 = uVar8 + 1) {
        lVar7 = *(long *)((long)pvVar6 + uVar8 * 8);
        if (uVar8 < 5) {
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            *(undefined4 *)(lVar7 + uVar11 * 4) = (&DAT_0085a4c0)[uVar8];
          }
        }
        else {
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            *(uint *)(lVar7 + uVar11 * 4) =
                 -(uint)((1 << ((char)uVar8 - 5U & 0x1f) & (uint)uVar11) != 0);
          }
        }
      }
    }
    vTruth->nSize = 0;
    vVisited->nSize = 0;
    pauVar14 = Gia_ManConvertAigToTruth::uTruths;
    for (lVar7 = 0; lVar7 < vLeaves->nSize; lVar7 = lVar7 + 1) {
      iVar3 = Vec_IntEntry(vLeaves,(int)lVar7);
      pGVar9 = Gia_ManObj(p,iVar3);
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      puVar5 = Vec_IntFetch(vTruth,iVar4);
      pIn = pauVar14;
      if (__ptr != (int *)0x0) {
        if (__ptr[1] <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pIn = *(uint (**) [8])(*(long *)(__ptr + 2) + lVar7 * 8);
      }
      Gia_ManTruthCopy(puVar5,*pIn,iVar12);
      pVVar1 = p->vTruths;
      iVar3 = Gia_ObjId(p,pGVar9);
      Vec_IntSetEntry(pVVar1,iVar3,vVisited->nSize);
      iVar3 = Gia_ObjId(p,pGVar9);
      Vec_IntPush(vVisited,iVar3);
      pauVar14 = pauVar14 + 1;
    }
    if (__ptr != (int *)0x0) {
      free(*(void **)(__ptr + 2));
      free(__ptr);
    }
    puVar5 = Gia_ManConvertAigToTruth_rec
                       (p,(Gia_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe),vTruth,iVar4,vVisited);
    if (((ulong)pRoot & 1) != 0) {
      for (; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
        puVar5[uVar13 - 1] = ~puVar5[uVar13 - 1];
      }
    }
    for (iVar12 = 0; iVar12 < vVisited->nSize; iVar12 = iVar12 + 1) {
      iVar4 = Vec_IntEntry(vVisited,iVar12);
      pGVar9 = Gia_ManObj(p,iVar4);
      if (pGVar9 == (Gia_Obj_t *)0x0) {
        return puVar5;
      }
      pVVar1 = p->vTruths;
      iVar4 = Gia_ObjId(p,pGVar9);
      Vec_IntSetEntry(pVVar1,iVar4,-1);
    }
  }
  return puVar5;
}

Assistant:

unsigned * Gia_ManConvertAigToTruth( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vTruth, Vec_Int_t * vVisited )
{
    static unsigned uTruths[8][8] = { // elementary truth tables
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Gia_Obj_t * pObj;
    Vec_Ptr_t * vTtElems = NULL;
    unsigned * pTruth;//, * pTruth2;
    int i, nWords, nVars;
    // get the number of variables and words
    nVars  = Vec_IntSize( vLeaves );
    nWords = Abc_TruthWordNum( nVars );
    // check the case of a constant
    if ( Gia_ObjIsConst0( Gia_Regular(pRoot) ) )
    {
        Vec_IntClear( vTruth );
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        if ( !Gia_IsComplement(pRoot) )
            Gia_ManTruthClear( pTruth, nVars );
        else
            Gia_ManTruthFill( pTruth, nVars );
        return pTruth;
    }
    // if the number of variables is more than 8, allocate truth tables
    if ( nVars > 8 )
        vTtElems = Vec_PtrAllocTruthTables( nVars );
    // assign elementary truth tables
    Vec_IntClear( vTruth );
    Vec_IntClear( vVisited );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        // assign elementary variable
        if ( vTtElems )
            Gia_ManTruthCopy( pTruth, (unsigned *)Vec_PtrEntry(vTtElems, i), nVars );
        else
            Gia_ManTruthCopy( pTruth, uTruths[i], nVars );
        // save the visited node
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), Vec_IntSize(vVisited) );
        Vec_IntPush( vVisited, Gia_ObjId(p, pObj) );
    }
    if ( vTtElems )
        Vec_PtrFree( vTtElems );
    // clear the marks and compute the truth table
//    pTruth2 = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    pTruth = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    // copy the result
//    Gia_ManTruthCopy( pTruth, pTruth2, nVars );
    if ( Gia_IsComplement(pRoot) )
        Gia_ManTruthNot( pTruth, pTruth, nVars );
    // clean truth tables
    Gia_ManForEachObjVec( vVisited, p, pObj, i )
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), -1 );
    return pTruth;
}